

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
sequence<toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
::
invoke<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  value_type *other;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_c0;
  region<std::vector<char,_std::allocator<char>_>_> local_70;
  
  sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_c0,
             (sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>
              *)this,loc);
  if (local_c0.is_ok_ == false) {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap(&local_c0);
    region<std::vector<char,_std::allocator<char>_>_>::operator+=
              ((region<std::vector<char,_std::allocator<char>_>_> *)loc,other);
    region<std::vector<char,_std::allocator<char>_>_>::region
              (&local_70,(region<std::vector<char,_std::allocator<char>_>_> *)loc);
    reg = &local_70;
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,(success_type *)&local_70);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_70);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&local_c0,(EVP_PKEY_CTX *)reg);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return ok(reg);
    }